

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v10::vprint(FILE *f,string_view fmt,format_args args)

{
  memory_buffer buffer;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_220;
  
  local_220.super_buffer<char>.ptr_ = local_220.store_;
  local_220.super_buffer<char>.size_ = 0;
  local_220.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_002a3a00;
  local_220.super_buffer<char>.capacity_ = 500;
  detail::vformat_to<char>(&local_220.super_buffer<char>,fmt,args,(locale_ref)0x0);
  detail::fwrite_fully(local_220.super_buffer<char>.ptr_,local_220.super_buffer<char>.size_,f);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_220);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view fmt, format_args args) {
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  detail::print(f, {buffer.data(), buffer.size()});
}